

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

LIBSSH2_SFTP_HANDLE *
sftp_open(LIBSSH2_SFTP *sftp,char *filename,size_t filename_len,uint32_t flags,long mode,
         int open_type,LIBSSH2_SFTP_ATTRIBUTES *attrs_in)

{
  LIBSSH2_CHANNEL *channel;
  uint uVar1;
  libssh2_nonblocking_states lVar2;
  int iVar3;
  ssize_t sVar4;
  LIBSSH2_SFTP_HANDLE *entry;
  ulong uVar5;
  char *pcVar6;
  LIBSSH2_SESSION *session;
  uint32_t uVar7;
  bool bVar8;
  size_t in_stack_ffffffffffffff58;
  uchar *data;
  int local_94;
  size_t data_len;
  uint32_t local_84;
  LIBSSH2_SESSION *local_80;
  uchar *s;
  char *local_70;
  LIBSSH2_SFTP_ATTRIBUTES local_68;
  
  channel = sftp->channel;
  session = channel->session;
  local_68.atime = 0;
  local_68.mtime = 0;
  local_68.gid = 0;
  local_68.permissions = 0;
  local_68.filesize = 0;
  local_68.uid = 0;
  local_68.flags = 4;
  lVar2 = sftp->open_state;
  local_94 = open_type;
  if (lVar2 == libssh2_NB_state_created) {
LAB_001228c7:
    sVar4 = _libssh2_channel_write
                      (channel,0,sftp->open_packet + sftp->open_packet_sent,
                       (ulong)sftp->open_packet_len - sftp->open_packet_sent);
    if (sVar4 != -0x25) {
      if (sVar4 < 0) {
        _libssh2_error(session,(int)sVar4,"Unable to send FXP_OPEN*");
        (*session->free)(sftp->open_packet,&session->abstract);
        sftp->open_packet = (uchar *)0x0;
        sftp->open_state = libssh2_NB_state_idle;
        return (LIBSSH2_SFTP_HANDLE *)0x0;
      }
      uVar5 = sftp->open_packet_sent + sVar4;
      sftp->open_packet_sent = uVar5;
      if (uVar5 != sftp->open_packet_len) {
        lVar2 = sftp->open_state;
        goto LAB_0012298b;
      }
      (*session->free)(sftp->open_packet,&session->abstract);
      sftp->open_packet = (uchar *)0x0;
      sftp->open_state = libssh2_NB_state_sent;
      goto LAB_00122990;
    }
    pcVar6 = "Would block sending FXP_OPEN or FXP_OPENDIR command";
  }
  else {
    if (lVar2 == libssh2_NB_state_idle) {
      sftp->last_errno = 0;
      if (attrs_in != (LIBSSH2_SFTP_ATTRIBUTES *)0x0) {
        local_68.mtime = attrs_in->mtime;
        local_68.flags = attrs_in->flags;
        local_68.filesize = attrs_in->filesize;
        local_68.uid = attrs_in->uid;
        local_68.gid = attrs_in->gid;
        local_68.permissions = attrs_in->permissions;
        local_68.atime = attrs_in->atime;
      }
      local_80 = session;
      local_70 = filename;
      if (open_type == 0) {
        iVar3 = sftp_attrsize(local_68.flags);
        iVar3 = iVar3 + 4;
      }
      else {
        iVar3 = 0;
      }
      session = local_80;
      uVar7 = (int)filename_len + 0xd + iVar3;
      sftp->open_packet_len = uVar7;
      sftp->open_packet_sent = 0;
      s = (uchar *)(*local_80->alloc)((size_t)uVar7,&local_80->abstract);
      iVar3 = local_94;
      sftp->open_packet = s;
      if (s == (uchar *)0x0) {
        pcVar6 = "Unable to allocate memory for FXP_OPEN or FXP_OPENDIR packet";
        iVar3 = -6;
        s = (uchar *)0x0;
        goto LAB_001229ef;
      }
      bVar8 = local_94 == 0;
      local_68.permissions = (ulong)bVar8 * 0x4000 + 0x4000 | mode;
      local_84 = flags;
      _libssh2_store_u32(&s,sftp->open_packet_len - 4);
      *s = !bVar8 << 3 | 3;
      uVar7 = sftp->request_id;
      sftp->request_id = uVar7 + 1;
      sftp->open_request_id = uVar7;
      s = s + 1;
      _libssh2_store_u32(&s,uVar7);
      _libssh2_store_str(&s,local_70,filename_len);
      if (iVar3 == 0) {
        _libssh2_store_u32(&s,local_84);
        sVar4 = sftp_attr2bin(s,&local_68);
        s = s + sVar4;
      }
      sftp->open_state = libssh2_NB_state_created;
      session = local_80;
      goto LAB_001228c7;
    }
LAB_0012298b:
    if (lVar2 != libssh2_NB_state_sent) {
      return (LIBSSH2_SFTP_HANDLE *)0x0;
    }
LAB_00122990:
    data_len = 0;
    iVar3 = sftp_packet_requirev
                      (sftp,0x1319e8,(uchar *)(ulong)sftp->open_request_id,(uint32_t)&data,
                       (uchar **)&data_len,(size_t *)0x1,in_stack_ffffffffffffff58);
    if (iVar3 == -0x26) {
      if (data_len != 0) {
        (*session->free)(data,&session->abstract);
      }
      pcVar6 = "Response too small";
LAB_001229e9:
      iVar3 = -0x1f;
      goto LAB_001229ef;
    }
    if (iVar3 != -0x25) {
      sftp->open_state = libssh2_NB_state_idle;
      if (iVar3 != 0) {
        pcVar6 = "Timeout waiting for status message";
        goto LAB_001229ef;
      }
      if (*data == 'e') {
        if (data_len < 9) {
          pcVar6 = "Too small FXP_STATUS";
        }
        else {
          uVar7 = _libssh2_ntohu32(data + 5);
          sftp->last_errno = uVar7;
          if (uVar7 == 0) {
            (*session->free)(data,&session->abstract);
            iVar3 = sftp_packet_require(sftp,'f',sftp->open_request_id,&data,&data_len,10);
            if (iVar3 == -0x26) {
              if (data_len != 0) {
                (*session->free)(data,&session->abstract);
              }
              pcVar6 = "Too small FXP_HANDLE";
              goto LAB_001229e9;
            }
            if (iVar3 == 0) goto LAB_00122aa8;
            if (iVar3 == -0x25) {
              sftp->open_state = libssh2_NB_state_sent;
              return (LIBSSH2_SFTP_HANDLE *)0x0;
            }
          }
          pcVar6 = "Failed opening remote file";
        }
      }
      else {
LAB_00122aa8:
        if (9 < data_len) {
          entry = (LIBSSH2_SFTP_HANDLE *)_libssh2_calloc(session,0x1088);
          if (entry != (LIBSSH2_SFTP_HANDLE *)0x0) {
            entry->handle_type = (uint)(local_94 != 0);
            uVar7 = _libssh2_ntohu32(data + 5);
            uVar1 = 0xffc;
            if (uVar7 < 0xffc) {
              uVar1 = uVar7;
            }
            uVar5 = data_len - 9;
            if ((ulong)uVar1 <= data_len - 9) {
              uVar5 = (ulong)uVar1;
            }
            entry->handle_len = uVar5;
            memcpy(entry->handle,data + 9,uVar5);
            (*session->free)(data,&session->abstract);
            _libssh2_list_add(&sftp->sftp_handles,(list_node *)entry);
            entry->sftp = sftp;
            (entry->u).file.offset = 0;
            (entry->u).file.offset_sent = 0;
            return entry;
          }
          pcVar6 = "Unable to allocate new SFTP handle structure";
          iVar3 = -6;
          goto LAB_00122ab9;
        }
        pcVar6 = "Too small FXP_HANDLE";
      }
      iVar3 = -0x1f;
LAB_00122ab9:
      _libssh2_error(session,iVar3,pcVar6);
      (*session->free)(data,&session->abstract);
      return (LIBSSH2_SFTP_HANDLE *)0x0;
    }
    pcVar6 = "Would block waiting for status message";
  }
  iVar3 = -0x25;
LAB_001229ef:
  _libssh2_error(session,iVar3,pcVar6);
  return (LIBSSH2_SFTP_HANDLE *)0x0;
}

Assistant:

static LIBSSH2_SFTP_HANDLE *
sftp_open(LIBSSH2_SFTP *sftp, const char *filename,
          size_t filename_len, uint32_t flags, long mode,
          int open_type, LIBSSH2_SFTP_ATTRIBUTES *attrs_in)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    LIBSSH2_SFTP_HANDLE *fp;
    LIBSSH2_SFTP_ATTRIBUTES attrs = {
        LIBSSH2_SFTP_ATTR_PERMISSIONS, 0, 0, 0, 0, 0, 0
    };
    unsigned char *s;
    ssize_t rc;
    int open_file = (open_type == LIBSSH2_SFTP_OPENFILE) ? 1 : 0;

    if(sftp->open_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        if(attrs_in) {
            memcpy(&attrs, attrs_in, sizeof(LIBSSH2_SFTP_ATTRIBUTES));
        }

        /* packet_len(4) + packet_type(1) + request_id(4) + filename_len(4) +
           flags(4) */
        sftp->open_packet_len = (uint32_t)(filename_len + 13 +
            (open_file ? (4 + sftp_attrsize(attrs.flags)) : 0));

        /* surprise! this starts out with nothing sent */
        sftp->open_packet_sent = 0;
        s = sftp->open_packet = LIBSSH2_ALLOC(session, sftp->open_packet_len);
        if(!sftp->open_packet) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for FXP_OPEN or "
                           "FXP_OPENDIR packet");
            return NULL;
        }
        /* Filetype in SFTP 3 and earlier */
        attrs.permissions = mode |
            (open_file ? LIBSSH2_SFTP_ATTR_PFILETYPE_FILE :
             LIBSSH2_SFTP_ATTR_PFILETYPE_DIR);

        _libssh2_store_u32(&s, sftp->open_packet_len - 4);
        *(s++) = open_file ? SSH_FXP_OPEN : SSH_FXP_OPENDIR;
        sftp->open_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->open_request_id);
        _libssh2_store_str(&s, filename, filename_len);

        if(open_file) {
            _libssh2_store_u32(&s, flags);
            s += sftp_attr2bin(s, &attrs);
        }

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Sending %s open request",
                       open_file ? "file" : "directory"));

        sftp->open_state = libssh2_NB_state_created;
    }

    if(sftp->open_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, sftp->open_packet+
                                    sftp->open_packet_sent,
                                    sftp->open_packet_len -
                                    sftp->open_packet_sent);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending FXP_OPEN or "
                           "FXP_OPENDIR command");
            return NULL;
        }
        else if(rc < 0) {
            _libssh2_error(session, (int)rc, "Unable to send FXP_OPEN*");
            LIBSSH2_FREE(session, sftp->open_packet);
            sftp->open_packet = NULL;
            sftp->open_state = libssh2_NB_state_idle;
            return NULL;
        }

        /* bump the sent counter and remain in this state until the whole
           data is off */
        sftp->open_packet_sent += rc;

        if(sftp->open_packet_len == sftp->open_packet_sent) {
            LIBSSH2_FREE(session, sftp->open_packet);
            sftp->open_packet = NULL;

            sftp->open_state = libssh2_NB_state_sent;
        }
    }

    if(sftp->open_state == libssh2_NB_state_sent) {
        size_t data_len = 0;
        unsigned char *data;
        static const unsigned char fopen_responses[2] =
            { SSH_FXP_HANDLE, SSH_FXP_STATUS };
        rc = sftp_packet_requirev(sftp, 2, fopen_responses,
                                  sftp->open_request_id, &data,
                                  &data_len, 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block waiting for status message");
            return NULL;
        }
        else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
            if(data_len > 0) {
                LIBSSH2_FREE(session, data);
            }
            _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                           "Response too small");
            return NULL;
        }
        sftp->open_state = libssh2_NB_state_idle;
        if(rc) {
            _libssh2_error(session, (int)rc,
                           "Timeout waiting for status message");
            return NULL;
        }

        /* OPEN can basically get STATUS or HANDLE back, where HANDLE implies
           a fine response while STATUS means error. It seems though that at
           times we get an SSH_FX_OK back in a STATUS, followed the "real"
           HANDLE so we need to properly deal with that. */
        if(data[0] == SSH_FXP_STATUS) {
            int badness = 1;

            if(data_len < 9) {
                _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                               "Too small FXP_STATUS");
                LIBSSH2_FREE(session, data);
                return NULL;
            }

            sftp->last_errno = _libssh2_ntohu32(data + 5);

            if(LIBSSH2_FX_OK == sftp->last_errno) {
                _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                               "got HANDLE FXOK"));

                LIBSSH2_FREE(session, data);

                /* silly situation, but check for a HANDLE */
                rc = sftp_packet_require(sftp, SSH_FXP_HANDLE,
                                         sftp->open_request_id, &data,
                                         &data_len, 10);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    /* go back to sent state and wait for something else */
                    sftp->open_state = libssh2_NB_state_sent;
                    return NULL;
                }
                else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                    if(data_len > 0) {
                        LIBSSH2_FREE(session, data);
                    }
                    _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                   "Too small FXP_HANDLE");
                    return NULL;
                }
                else if(!rc)
                    /* we got the handle so this is not a bad situation */
                    badness = 0;
            }

            if(badness) {
                _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                               "Failed opening remote file");
                _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                               "got FXP_STATUS %d",
                               sftp->last_errno));
                LIBSSH2_FREE(session, data);
                return NULL;
            }
        }

        if(data_len < 10) {
            _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                           "Too small FXP_HANDLE");
            LIBSSH2_FREE(session, data);
            return NULL;
        }

        fp = LIBSSH2_CALLOC(session, sizeof(LIBSSH2_SFTP_HANDLE));
        if(!fp) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate new SFTP handle structure");
            LIBSSH2_FREE(session, data);
            return NULL;
        }
        fp->handle_type = open_file ? LIBSSH2_SFTP_HANDLE_FILE :
            LIBSSH2_SFTP_HANDLE_DIR;

        fp->handle_len = _libssh2_ntohu32(data + 5);
        if(fp->handle_len > SFTP_HANDLE_MAXLEN)
            /* SFTP doesn't allow handles longer than 256 characters */
            fp->handle_len = SFTP_HANDLE_MAXLEN;

        if(fp->handle_len > (data_len - 9))
            /* do not reach beyond the end of the data we got */
            fp->handle_len = data_len - 9;

        memcpy(fp->handle, data + 9, fp->handle_len);

        LIBSSH2_FREE(session, data);

        /* add this file handle to the list kept in the sftp session */
        _libssh2_list_add(&sftp->sftp_handles, &fp->node);

        fp->sftp = sftp; /* point to the parent struct */

        fp->u.file.offset = 0;
        fp->u.file.offset_sent = 0;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Open command successful"));
        return fp;
    }
    return NULL;
}